

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConditionalStatements.cpp
# Opt level: O3

pair<const_slang::ast::Statement_*,_bool> __thiscall
slang::ast::CaseStatement::getKnownBranch(CaseStatement *this,EvalContext *context)

{
  UniquePriorityCheck UVar1;
  size_t sVar2;
  logic_t lVar3;
  variant_alternative_t<1UL,_variant<monostate,_SVInt,_real_t,_shortreal_t,_NullPlaceholder,_vector<ConstantValue,_allocator<ConstantValue>_>,_basic_string<char,_char_traits<char>,_allocator<char>_>,_CopyPtr<AssociativeArray>,_CopyPtr<SVQueue>,_CopyPtr<SVUnion>,_UnboundedPlaceholder>_>
  *this_00;
  Diagnostic *pDVar4;
  pointer pIVar5;
  char *pcVar6;
  ValueRangeExpression *this_01;
  long lVar7;
  Statement *pSVar8;
  bool bVar9;
  pair<const_slang::ast::Statement_*,_bool> pVar10;
  string_view arg;
  SourceRange range;
  ConstantValue val;
  ConstantValue cv;
  Type *local_c0;
  SourceLocation local_b0;
  SourceLocation local_a8;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_90;
  pointer local_68;
  pointer local_60;
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  local_58;
  
  this_01 = (ValueRangeExpression *)&local_58;
  Expression::eval((ConstantValue *)this_01,this->expr,context);
  if (local_58._M_index == '\0') {
    if (this->expr->kind != TypeReference) {
LAB_004452c6:
      pSVar8 = (Statement *)0x0;
      this_01 = (ValueRangeExpression *)0x0;
      goto LAB_004452cb;
    }
    local_c0 = *(Type **)(this->expr + 1);
  }
  else {
    local_c0 = (Type *)0x0;
  }
  sVar2 = (this->items)._M_extent._M_extent_value;
  if (sVar2 != 0) {
    UVar1 = this->check;
    pIVar5 = (this->items)._M_ptr;
    local_68 = pIVar5 + sVar2;
    pSVar8 = (Statement *)0x0;
    local_a8 = (SourceLocation)0x0;
    local_b0 = (SourceLocation)0x0;
    do {
      sVar2 = (pIVar5->expressions)._M_extent._M_extent_value;
      if (sVar2 != 0) {
        local_60 = (pIVar5->expressions)._M_ptr;
        lVar7 = 0;
        do {
          this_01 = *(ValueRangeExpression **)((long)local_60 + lVar7);
          if ((this_01->super_Expression).kind == ValueRange) {
            ValueRangeExpression::checkInside
                      ((ConstantValue *)&local_90,this_01,context,(ConstantValue *)&local_58);
            if (local_90._M_index == '\0') {
LAB_004452bc:
              std::__detail::__variant::
              _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
              ::~_Variant_storage(&local_90);
              goto LAB_004452c6;
            }
            this_00 = std::
                      get<1ul,std::monostate,slang::SVInt,slang::real_t,slang::shortreal_t,slang::ConstantValue::NullPlaceholder,std::vector<slang::ConstantValue,std::allocator<slang::ConstantValue>>,std::__cxx11::string,slang::CopyPtr<slang::AssociativeArray>,slang::CopyPtr<slang::SVQueue>,slang::CopyPtr<slang::SVUnion>,slang::ConstantValue::UnboundedPlaceholder>
                                ((variant<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                  *)&local_90);
            lVar3 = SVInt::reductionOr(this_00);
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage(&local_90);
            if (((lVar3.value != '\0') && (lVar3.value != 0x80)) && (lVar3.value != '@'))
            goto LAB_004451ed;
          }
          else {
            Expression::eval((ConstantValue *)&local_90,&this_01->super_Expression,context);
            if (local_90._M_index == '\0') {
              if ((local_c0 == (Type *)0x0) || ((this_01->super_Expression).kind != TypeReference))
              goto LAB_004452bc;
              bVar9 = Type::isMatching(*(Type **)&this_01->rangeKind,local_c0);
            }
            else {
              bVar9 = checkMatch(this->condition,(ConstantValue *)&local_58,
                                 (ConstantValue *)&local_90);
            }
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage(&local_90);
            if (bVar9 != false) {
LAB_004451ed:
              if (pSVar8 != (Statement *)0x0) {
                pDVar4 = EvalContext::addDiag
                                   (context,(DiagCode)0x3000c,
                                    (this_01->super_Expression).sourceRange);
                pDVar4 = Diagnostic::operator<<(pDVar4,(ConstantValue *)&local_58);
                this_01 = (ValueRangeExpression *)CONCAT71((int7)((ulong)this_01 >> 8),1);
                range.endLoc = local_b0;
                range.startLoc = local_a8;
                Diagnostic::addNote(pDVar4,(DiagCode)0xb0001,range);
                goto LAB_004452cb;
              }
              pSVar8 = (pIVar5->stmt).ptr;
              local_a8 = (this_01->super_Expression).sourceRange.startLoc;
              local_b0 = (this_01->super_Expression).sourceRange.endLoc;
              break;
            }
          }
          lVar7 = lVar7 + 8;
        } while (sVar2 << 3 != lVar7);
      }
      this_01 = (ValueRangeExpression *)CONCAT71((int7)((ulong)this_01 >> 8),1);
      if ((pSVar8 != (Statement *)0x0) && (1 < UVar1 - Unique)) goto LAB_004452cb;
      pIVar5 = pIVar5 + 1;
    } while (pIVar5 != local_68);
    if (pSVar8 != (Statement *)0x0) goto LAB_004452cb;
  }
  pSVar8 = this->defaultCase;
  this_01 = (ValueRangeExpression *)CONCAT71((int7)((ulong)this_01 >> 8),1);
  if (pSVar8 == (Statement *)0x0) {
    if ((this->check | Unique0) == Priority) {
      pDVar4 = EvalContext::addDiag(context,(DiagCode)0x13000c,this->expr->sourceRange);
      bVar9 = this->check == Priority;
      pcVar6 = "unique";
      if (bVar9) {
        pcVar6 = "priority";
      }
      arg._M_str = pcVar6;
      arg._M_len = (ulong)bVar9 * 2 + 6;
      Diagnostic::operator<<(pDVar4,arg);
      Diagnostic::operator<<(pDVar4,(ConstantValue *)&local_58);
    }
    pSVar8 = (Statement *)0x0;
  }
LAB_004452cb:
  std::__detail::__variant::
  _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
  ::~_Variant_storage(&local_58);
  pVar10._8_8_ = (ulong)this_01 & 0xffffffff;
  pVar10.first = pSVar8;
  return pVar10;
}

Assistant:

std::pair<const Statement*, bool> CaseStatement::getKnownBranch(EvalContext& context) const {
    const Type* condType = nullptr;
    auto cv = expr.eval(context);
    if (!cv) {
        if (expr.kind == ExpressionKind::TypeReference)
            condType = &expr.as<TypeReferenceExpression>().targetType;
        else
            return {nullptr, false};
    }

    const Statement* matchedStmt = nullptr;
    SourceRange matchRange;
    bool unique = check == UniquePriorityCheck::Unique || check == UniquePriorityCheck::Unique0;

    for (auto& group : items) {
        for (auto item : group.expressions) {
            bool matched;
            if (item->kind == ExpressionKind::ValueRange) {
                ConstantValue val = item->as<ValueRangeExpression>().checkInside(context, cv);
                if (!val)
                    return {nullptr, false};

                matched = (bool)(logic_t)val.integer();
            }
            else {
                auto val = item->eval(context);
                if (val)
                    matched = checkMatch(condition, cv, val);
                else if (condType && item->kind == ExpressionKind::TypeReference)
                    matched = item->as<TypeReferenceExpression>().targetType.isMatching(*condType);
                else
                    return {nullptr, false};
            }

            if (matched) {
                // If we already matched with a previous item, the only we reason
                // we'd still get here is to check for uniqueness. The presence of
                // another match means we failed the uniqueness check.
                if (matchedStmt) {
                    auto& diag =
                        context.addDiag(diag::ConstEvalCaseItemsNotUnique, item->sourceRange) << cv;
                    diag.addNote(diag::NotePreviousMatch, matchRange);
                    unique = false;
                }
                else {
                    // Always break out of the item group once we find a match -- even when
                    // checking uniqueness, expressions in a single group are not required
                    // to be unique.
                    matchedStmt = group.stmt;
                    matchRange = item->sourceRange;
                }
                break;
            }
        }

        if (matchedStmt && !unique)
            break;
    }

    if (!matchedStmt)
        matchedStmt = defaultCase;

    if (!matchedStmt &&
        (check == UniquePriorityCheck::Priority || check == UniquePriorityCheck::Unique)) {

        auto& diag = context.addDiag(diag::ConstEvalNoCaseItemsMatched, expr.sourceRange);
        diag << (check == UniquePriorityCheck::Priority ? "priority"sv : "unique"sv);
        diag << cv;
    }

    return {matchedStmt, true};
}